

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O3

Abc_Cex_t * Abc_CexMerge(Abc_Cex_t *pCex,Abc_Cex_t *pPart,int iFrBeg,int iFrEnd)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Abc_Cex_t *pAVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  bool bVar13;
  
  if (iFrBeg < 0) {
    pcVar12 = "Starting frame is less than 0.";
  }
  else {
    if (-1 < iFrEnd) {
      uVar1 = pCex->iFrame;
      if ((int)uVar1 < iFrBeg) {
        pcVar12 = "Starting frame is more than the last frame of CEX (%d).\n";
      }
      else {
        if ((uint)iFrEnd <= uVar1) {
          if ((uint)iFrEnd < (uint)iFrBeg) {
            printf("Starting frame (%d) should be less than stopping frame (%d).\n",
                   (ulong)(uint)iFrBeg,(ulong)(uint)iFrEnd);
            return (Abc_Cex_t *)0x0;
          }
          iVar2 = pCex->nPis;
          if (iVar2 != pPart->nPis) {
            __assert_fail("pCex->nPis == pPart->nPis",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                          ,0xd9,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
          }
          iVar3 = (iFrEnd - iFrBeg) + pPart->iPo;
          iVar7 = pPart->iFrame;
          if (iVar3 < iVar7) {
            __assert_fail("iFrEnd - iFrBeg + pPart->iPo >= pPart->iFrame",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                          ,0xda,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
          }
          uVar8 = pCex->nRegs;
          iVar3 = iVar7 - iVar3;
          uVar5 = (iVar3 + uVar1 + 1) * iVar2 + uVar8;
          pAVar4 = (Abc_Cex_t *)
                   calloc(1,(long)(int)((((int)uVar5 >> 5) + 1) - (uint)((uVar5 & 0x1f) == 0)) * 4 +
                            0x14);
          pAVar4->nRegs = uVar8;
          pAVar4->nPis = iVar2;
          pAVar4->nBits = uVar5;
          pAVar4->iPo = pCex->iPo;
          pAVar4->iFrame = iVar3 + uVar1;
          uVar6 = 0;
          uVar5 = 0;
          if (0 < (int)uVar8) {
            do {
              if (((uint)(&pCex[1].iPo)[uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
                (&pAVar4[1].iPo)[uVar6 >> 5] =
                     (&pAVar4[1].iPo)[uVar6 >> 5] | 1 << ((byte)uVar6 & 0x1f);
              }
              uVar6 = uVar6 + 1;
              uVar5 = uVar8;
            } while (uVar8 != uVar6);
          }
          if (iFrBeg != 0) {
            iVar3 = 0;
            uVar6 = uVar8;
            do {
              iVar10 = iVar2;
              uVar9 = uVar6;
              if (0 < iVar2) {
                do {
                  if (((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0) {
                    (&pAVar4[1].iPo)[(int)uVar5 >> 5] =
                         (&pAVar4[1].iPo)[(int)uVar5 >> 5] | 1 << ((byte)uVar5 & 0x1f);
                  }
                  uVar5 = uVar5 + 1;
                  uVar9 = uVar9 + 1;
                  iVar10 = iVar10 + -1;
                } while (iVar10 != 0);
              }
              iVar3 = iVar3 + 1;
              uVar6 = uVar6 + iVar2;
            } while (iVar3 != iFrBeg);
          }
          if (0 < iVar7) {
            iVar3 = 0;
            iVar10 = 0;
            do {
              if (0 < iVar2) {
                uVar6 = pPart->nRegs + iVar3;
                iVar11 = iVar2;
                do {
                  if (((uint)(&pPart[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
                    (&pAVar4[1].iPo)[(int)uVar5 >> 5] =
                         (&pAVar4[1].iPo)[(int)uVar5 >> 5] | 1 << ((byte)uVar5 & 0x1f);
                  }
                  uVar5 = uVar5 + 1;
                  uVar6 = uVar6 + 1;
                  iVar11 = iVar11 + -1;
                } while (iVar11 != 0);
              }
              iVar10 = iVar10 + 1;
              iVar3 = iVar3 + iVar2;
            } while (iVar10 != iVar7);
          }
          uVar8 = uVar8 + iVar2 * iFrEnd;
          do {
            iVar7 = iVar2;
            uVar6 = uVar8;
            if (0 < iVar2) {
              do {
                if (((uint)(&pCex[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
                  (&pAVar4[1].iPo)[(int)uVar5 >> 5] =
                       (&pAVar4[1].iPo)[(int)uVar5 >> 5] | 1 << ((byte)uVar5 & 0x1f);
                }
                uVar5 = uVar5 + 1;
                iVar7 = iVar7 + -1;
                uVar6 = uVar6 + 1;
              } while (iVar7 != 0);
            }
            uVar8 = uVar8 + iVar2;
            bVar13 = iFrEnd != uVar1;
            iFrEnd = iFrEnd + 1;
          } while (bVar13);
          if (uVar5 == pAVar4->nBits) {
            return pAVar4;
          }
          __assert_fail("iBit == pNew->nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                        ,0xf0,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
        }
        pcVar12 = "Stopping frame is more than the last frame of CEX (%d).\n";
      }
      printf(pcVar12,(ulong)uVar1);
      return (Abc_Cex_t *)0x0;
    }
    pcVar12 = "Stopping frame is less than 0.";
  }
  puts(pcVar12);
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Abc_CexMerge( Abc_Cex_t * pCex, Abc_Cex_t * pPart, int iFrBeg, int iFrEnd )
{
    Abc_Cex_t * pNew;
    int nFramesGain;
    int i, f, iBit;

    if ( iFrBeg < 0 )
        { printf( "Starting frame is less than 0.\n" ); return NULL; }
    if ( iFrEnd < 0 )
        { printf( "Stopping frame is less than 0.\n" ); return NULL; }
    if ( iFrBeg > pCex->iFrame )
        { printf( "Starting frame is more than the last frame of CEX (%d).\n", pCex->iFrame ); return NULL; }
    if ( iFrEnd > pCex->iFrame )
        { printf( "Stopping frame is more than the last frame of CEX (%d).\n", pCex->iFrame ); return NULL; }
    if ( iFrBeg > iFrEnd )
        { printf( "Starting frame (%d) should be less than stopping frame (%d).\n", iFrBeg, iFrEnd ); return NULL; }
    assert( iFrBeg >= 0 && iFrBeg <= pCex->iFrame );
    assert( iFrEnd >= 0 && iFrEnd <= pCex->iFrame );
    assert( iFrBeg <= iFrEnd );

    assert( pCex->nPis == pPart->nPis );
    assert( iFrEnd - iFrBeg + pPart->iPo >= pPart->iFrame );

    nFramesGain = iFrEnd - iFrBeg + pPart->iPo - pPart->iFrame;
    pNew = Abc_CexAlloc( pCex->nRegs, pCex->nPis, pCex->iFrame + 1 - nFramesGain );
    pNew->iPo    = pCex->iPo;
    pNew->iFrame = pCex->iFrame - nFramesGain;

    for ( iBit = 0; iBit < pCex->nRegs; iBit++ )
        if ( Abc_InfoHasBit(pCex->pData, iBit) )
            Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = 0; f < iFrBeg; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = 0; f < pPart->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pPart->pData, pPart->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = iFrEnd; f <= pCex->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    assert( iBit == pNew->nBits );

    return pNew;
}